

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O1

ssize_t tnt_object_add_array(tnt_stream *s,uint32_t size)

{
  uint32_t *puVar1;
  byte bVar2;
  void *pvVar3;
  tnt_sbuf_object *sbo;
  tnt_sbo_stack *ptVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  byte local_2e;
  uint local_2d;
  char data [6];
  
  pvVar3 = s->data;
  sbo = *(tnt_sbuf_object **)((long)pvVar3 + 0x30);
  bVar2 = sbo->stack_size;
  if (bVar2 != 0) {
    puVar1 = &sbo->stack[bVar2 - 1].size;
    *puVar1 = *puVar1 + 1;
  }
  if ((bVar2 == sbo->stack_alloc) && (iVar5 = tnt_sbuf_object_grow_stack(sbo), iVar5 == -1)) {
    return -1;
  }
  ptVar4 = sbo->stack;
  bVar2 = sbo->stack_size;
  ptVar4[bVar2].size = 0;
  ptVar4[bVar2].offset = *(size_t *)((long)pvVar3 + 8);
  ptVar4[bVar2].type = '\x05';
  sbo->stack_size = bVar2 + 1;
  iVar5 = *(int *)(*(long *)((long)s->data + 0x30) + 0xc);
  if (iVar5 == 2) {
    local_2e = 0x90;
LAB_001132c1:
    sVar7 = 1;
  }
  else {
    if (iVar5 == 1) {
      local_2d = 0;
    }
    else {
      if (iVar5 != 0) {
        return -1;
      }
      if (size < 0x10) {
        local_2e = (byte)size | 0x90;
        goto LAB_001132c1;
      }
      if (size < 0x10000) {
        local_2e = 0xdc;
        local_2d = CONCAT22(local_2d._2_2_,(ushort)size << 8 | (ushort)size >> 8);
        sVar7 = 3;
        goto LAB_001132c6;
      }
      local_2d = size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18;
    }
    local_2e = 0xdd;
    sVar7 = 5;
  }
LAB_001132c6:
  sVar6 = (*s->write)(s,(char *)&local_2e,sVar7);
  return sVar6;
}

Assistant:

ssize_t
tnt_object_add_array (struct tnt_stream *s, uint32_t size)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	struct tnt_stream_buf  *sb  = TNT_SBUF_CAST(s);
	if (sbo->stack_size == sbo->stack_alloc)
		if (tnt_sbuf_object_grow_stack(sbo) == -1)
			return -1;
	sbo->stack[sbo->stack_size].size = 0;
	sbo->stack[sbo->stack_size].offset = sb->size;
	sbo->stack[sbo->stack_size].type = MP_ARRAY;
	sbo->stack_size += 1;
	if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SIMPLE) {
		end = mp_encode_array(data, size);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SPARSE) {
		end = mp_encode_array32(data, 0);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_PACKED) {
		end = mp_encode_array(data, 0);
	} else {
		return -1;
	}
	ssize_t rv = s->write(s, data, end - data);
	return rv;
}